

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

edata_t * extent_split_impl(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata,size_t size_a,
                           size_t size_b,_Bool holding_core_locks)

{
  int8_t *piVar1;
  ulong uVar2;
  uint64_t uVar3;
  void *pvVar4;
  void *pvVar5;
  _Bool _Var6;
  char cVar7;
  edata_t *trail;
  tsd_t *ptVar8;
  long *in_FS_OFFSET;
  emap_prepare_t prepare;
  emap_prepare_t local_50;
  
  if (*(long *)((long)(ehooks->ptr).repr + 0x38) == 0) {
    return (edata_t *)0x0;
  }
  trail = duckdb_je_edata_cache_get(tsdn,pac->edata_cache);
  if (trail == (edata_t *)0x0) {
    return (edata_t *)0x0;
  }
  uVar2 = edata->e_bits;
  uVar3 = edata->e_sn;
  trail->e_addr = (void *)(((ulong)edata->e_addr & 0xfffffffffffff000) + size_a);
  (trail->field_2).e_size_esn = (uint)(trail->field_2).e_size_esn & 0xfff | size_b;
  trail->e_sn = uVar3;
  trail->e_bits =
       (ulong)((uint)uVar2 & 0xea000) |
       (uVar2 & 0xffff) + (trail->e_bits & 0xffffeffff0000000) + 0xe800000 & 0xffffeffffe800fff;
  _Var6 = duckdb_je_emap_split_prepare(tsdn,pac->emap,&local_50,edata,size_a,trail,size_b);
  if (!_Var6) {
    pvVar4 = edata->e_addr;
    uVar2 = edata->e_bits;
    pvVar5 = (ehooks->ptr).repr;
    if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
      cVar7 = duckdb_je_ehooks_default_split_impl();
    }
    else {
      if (*(long *)((long)pvVar5 + 0x38) == 0) goto LAB_01196e02;
      ptVar8 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0'))
      {
        ptVar8 = duckdb_je_tsd_fetch_slow(ptVar8,false);
      }
      ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      if ((ptVar8->state).repr == '\0') {
        duckdb_je_tsd_slow_update(ptVar8);
      }
      cVar7 = (**(code **)((long)pvVar5 + 0x38))
                        (pvVar5,(ulong)pvVar4 & 0xfffffffffffff000,size_b + size_a,size_a,size_b,
                         (uint)(uVar2 >> 0xd) & 1,ehooks->ind);
      ptVar8 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0'))
      {
        ptVar8 = duckdb_je_tsd_fetch_slow(ptVar8,false);
      }
      piVar1 = &ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == '\0') {
        duckdb_je_tsd_slow_update(ptVar8);
      }
    }
    if (cVar7 == '\0') {
      (edata->field_2).e_size_esn = (uint)(edata->field_2).e_size_esn & 0xfff | size_a;
      duckdb_je_emap_split_commit(tsdn,pac->emap,&local_50,edata,size_a,trail,size_b);
      return trail;
    }
  }
LAB_01196e02:
  duckdb_je_edata_cache_put(tsdn,pac->edata_cache,trail);
  return (edata_t *)0x0;
}

Assistant:

static edata_t *
extent_split_impl(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata, size_t size_a, size_t size_b, bool holding_core_locks) {
	assert(edata_size_get(edata) == size_a + size_b);
	/* Only the shrink path may split w/o holding core locks. */
	if (holding_core_locks) {
		witness_assert_positive_depth_to_rank(
		    tsdn_witness_tsdp_get(tsdn), WITNESS_RANK_CORE);
	} else {
		witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
		    WITNESS_RANK_CORE, 0);
	}

	if (ehooks_split_will_fail(ehooks)) {
		return NULL;
	}

	edata_t *trail = edata_cache_get(tsdn, pac->edata_cache);
	if (trail == NULL) {
		goto label_error_a;
	}

	edata_init(trail, edata_arena_ind_get(edata),
	    (void *)((byte_t *)edata_base_get(edata) + size_a), size_b,
	    /* slab */ false, SC_NSIZES, edata_sn_get(edata),
	    edata_state_get(edata), edata_zeroed_get(edata),
	    edata_committed_get(edata), EXTENT_PAI_PAC, EXTENT_NOT_HEAD);
	emap_prepare_t prepare;
	bool err = emap_split_prepare(tsdn, pac->emap, &prepare, edata,
	    size_a, trail, size_b);
	if (err) {
		goto label_error_b;
	}

	/*
	 * No need to acquire trail or edata, because: 1) trail was new (just
	 * allocated); and 2) edata is either an active allocation (the shrink
	 * path), or in an acquired state (extracted from the ecache on the
	 * extent_recycle_split path).
	 */
	assert(emap_edata_is_acquired(tsdn, pac->emap, edata));
	assert(emap_edata_is_acquired(tsdn, pac->emap, trail));

	err = ehooks_split(tsdn, ehooks, edata_base_get(edata), size_a + size_b,
	    size_a, size_b, edata_committed_get(edata));

	if (err) {
		goto label_error_b;
	}

	edata_size_set(edata, size_a);
	emap_split_commit(tsdn, pac->emap, &prepare, edata, size_a, trail,
	    size_b);

	return trail;
label_error_b:
	edata_cache_put(tsdn, pac->edata_cache, trail);
label_error_a:
	return NULL;
}